

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZVTKGeoMesh.cpp
# Opt level: O0

void TPZVTKGeoMesh::SetMaterialVTK(TPZGeoEl *gel,int mat)

{
  int iVar1;
  long lVar2;
  TPZVec<long> *nodeindexes;
  long *plVar3;
  TPZGeoMesh *this;
  TPZChunkVector<TPZGeoNode,_10> *this_00;
  int in_ESI;
  TPZGeoEl *in_RDI;
  TPZGeoEl *son;
  int s;
  int nSons;
  int64_t elIndex;
  TPZVec<long> Topol;
  TPZVec<double> NodeCoord;
  int64_t nd;
  int64_t nnodes;
  int64_t in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff30;
  int in_stack_ffffffffffffff34;
  TPZGeoMesh *in_stack_ffffffffffffff38;
  TPZGeoNode *in_stack_ffffffffffffff40;
  TPZGeoNode *in_stack_ffffffffffffff48;
  int64_t in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  int iVar4;
  undefined4 in_stack_ffffffffffffff84;
  TPZVec<long> local_60 [2];
  ulong local_20;
  undefined4 in_stack_fffffffffffffff0;
  
  TPZGeoEl::SetMaterialId(in_RDI,in_ESI);
  iVar1 = (**(code **)(*(long *)in_RDI + 0x90))();
  lVar2 = (long)iVar1;
  for (local_20 = 0; (long)local_20 < lVar2; local_20 = local_20 + 1) {
    TPZVec<double>::TPZVec
              ((TPZVec<double> *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
               in_stack_ffffffffffffff28);
    TPZVec<long>::TPZVec
              ((TPZVec<long> *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
               in_stack_ffffffffffffff28);
    nodeindexes = (TPZVec<long> *)
                  (**(code **)(*(long *)in_RDI + 0xa8))(in_RDI,local_20 & 0xffffffff);
    plVar3 = TPZVec<long>::operator[](local_60,0);
    *plVar3 = (long)nodeindexes;
    this = TPZGeoEl::Mesh(in_RDI);
    iVar1 = (int)((ulong)plVar3 >> 0x20);
    TPZGeoMesh::NodeVec(this);
    this_00 = (TPZChunkVector<TPZGeoNode,_10> *)
              (**(code **)(*(long *)in_RDI + 0xa8))(in_RDI,local_20 & 0xffffffff);
    in_stack_ffffffffffffff48 =
         TPZChunkVector<TPZGeoNode,_10>::operator[](this_00,(int64_t)in_stack_ffffffffffffff48);
    TPZGeoNode::GetCoordinates
              (in_stack_ffffffffffffff40,(TPZVec<double> *)in_stack_ffffffffffffff38);
    in_stack_ffffffffffffff34 = in_ESI;
    in_stack_ffffffffffffff40 = (TPZGeoNode *)operator_new(0x90);
    in_stack_ffffffffffffff28 = 0;
    in_ESI = in_stack_ffffffffffffff34;
    in_stack_ffffffffffffff38 = TPZGeoEl::Mesh(in_RDI);
    TPZGeoElRefPattern<pzgeom::TPZGeoPoint>::TPZGeoElRefPattern
              ((TPZGeoElRefPattern<pzgeom::TPZGeoPoint> *)
               CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
               in_stack_ffffffffffffff78,nodeindexes,iVar1,this);
    TPZVec<long>::~TPZVec
              ((TPZVec<long> *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
    TPZVec<double>::~TPZVec
              ((TPZVec<double> *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
  }
  iVar1 = (**(code **)(*(long *)in_RDI + 0x1d0))();
  if (iVar1 != 0) {
    iVar1 = (**(code **)(*(long *)in_RDI + 0x148))();
    for (iVar4 = 0; iVar4 < iVar1; iVar4 = iVar4 + 1) {
      (**(code **)(*(long *)in_RDI + 0x1f8))(in_RDI,iVar4);
      SetMaterialVTK((TPZGeoEl *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),
                     (int)((ulong)lVar2 >> 0x20));
    }
  }
  return;
}

Assistant:

void TPZVTKGeoMesh::SetMaterialVTK(TPZGeoEl * gel, int mat) {
    gel->SetMaterialId(mat);

    int64_t nnodes = gel->NNodes();
    for (int64_t nd = 0; nd < nnodes; nd++) {
        TPZVec<REAL> NodeCoord(3);
        TPZVec<int64_t> Topol(1);

        int64_t elIndex = 0;

        Topol[0] = gel->NodeIndex(nd);

        gel->Mesh()->NodeVec()[gel->NodeIndex(nd)].GetCoordinates(NodeCoord);
        new TPZGeoElRefPattern< pzgeom::TPZGeoPoint > (elIndex, Topol, mat, *(gel->Mesh()));
    }

    if (gel->HasSubElement()) {
        int nSons = gel->NSubElements();
        for (int s = 0; s < nSons; s++) {
            TPZGeoEl * son = gel->SubElement(s);
            SetMaterialVTK(son, mat);
        }
    }
}